

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

float * __thiscall ImGuiStorage::GetFloatRef(ImGuiStorage *this,ImGuiID key,float default_val)

{
  ImGuiStoragePair *it;
  ImGuiStoragePair local_20;
  
  it = LowerBound(&this->Data,key);
  if ((it == (this->Data).Data + (this->Data).Size) || (it->key != key)) {
    local_20.key = key;
    local_20.field_1.val_f = default_val;
    it = ImVector<ImGuiStorage::ImGuiStoragePair>::insert(&this->Data,it,&local_20);
  }
  return (float *)&it->field_1;
}

Assistant:

float* ImGuiStorage::GetFloatRef(ImGuiID key, float default_val)
{
    ImGuiStoragePair* it = LowerBound(Data, key);
    if (it == Data.end() || it->key != key)
        it = Data.insert(it, ImGuiStoragePair(key, default_val));
    return &it->val_f;
}